

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoboKin_dns.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  long lVar3;
  uint uVar4;
  N_Vector y;
  long lVar5;
  long *plVar6;
  long lVar7;
  FILE *__stream;
  long lVar8;
  long lVar9;
  char *pcVar10;
  void *kmem;
  SUNContext sunctx;
  long local_48;
  undefined8 local_40;
  long local_38;
  
  local_48 = 0;
  puts("\nRobot Kinematics Example");
  puts("8 variables; -1 <= x_i <= 1");
  puts("KINSOL problem size: 8 + 2*8 = 24 \n");
  uVar4 = SUNContext_Create(0,&local_40);
  if ((int)uVar4 < 0) {
    pcVar10 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(0x18,local_40);
    if (y == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    lVar5 = N_VNew_Serial(0x18,local_40);
    if (lVar5 == 0) {
      main_cold_5();
      return 1;
    }
    plVar6 = (long *)N_VNew_Serial(0x18,local_40);
    if (plVar6 == (long *)0x0) {
      main_cold_4();
      return 1;
    }
    local_48 = KINCreate(local_40);
    if (local_48 == 0) {
      main_cold_3();
      return 1;
    }
    uVar4 = KINInit(local_48,func,y);
    if ((int)uVar4 < 0) {
      pcVar10 = "KINInit";
    }
    else {
      N_VConst(0,plVar6);
      lVar7 = *(long *)(*plVar6 + 0x10);
      lVar8 = 0;
      do {
        puVar2 = (undefined4 *)(lVar7 + 0x40 + lVar8 * 8);
        *puVar2 = 0;
        puVar2[1] = 0x3ff00000;
        puVar2[2] = 0;
        puVar2[3] = 0x3ff00000;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 0x10);
      uVar4 = KINSetConstraints(local_48,plVar6);
      if ((int)uVar4 < 0) {
        pcVar10 = "KINSetConstraints";
      }
      else {
        uVar4 = KINSetFuncNormTol(0x88e368f1,local_48);
        if ((int)uVar4 < 0) {
          pcVar10 = "KINSetFuncNormTol";
        }
        else {
          uVar4 = KINSetScaledStepTol(0x88e368f1,local_48);
          if ((int)uVar4 < 0) {
            pcVar10 = "KINSetScaledStepTol";
          }
          else {
            lVar7 = SUNDenseMatrix(0x18,0x18,local_40);
            if (lVar7 == 0) {
              main_cold_2();
              return 1;
            }
            lVar8 = SUNLinSol_Dense(y,lVar7,local_40);
            if (lVar8 == 0) {
              main_cold_1();
              return 1;
            }
            uVar4 = KINSetLinearSolver(local_48,lVar8,lVar7);
            if ((int)uVar4 < 0) {
              pcVar10 = "KINSetLinearSolver";
            }
            else {
              uVar4 = KINSetJacFn(local_48,jac);
              if ((int)uVar4 < 0) {
                pcVar10 = "KINSetJacFn";
              }
              else {
                uVar4 = KINSetMaxSetupCalls(local_48,1);
                if (-1 < (int)uVar4) {
                  N_VConst(0,y);
                  lVar3 = *(long *)((long)y->content + 0x10);
                  lVar9 = 0;
                  do {
                    puVar1 = (undefined8 *)(lVar3 + lVar9 * 8);
                    *puVar1 = 0x3fe6a09e667f3bcd;
                    puVar1[1] = 0x3fe6a09e667f3bcd;
                    lVar9 = lVar9 + 2;
                  } while (lVar9 != 8);
                  puts("Initial guess:");
                  PrintOutput(y);
                  N_VConst(0,lVar5);
                  uVar4 = KINSol(local_48,y,1,lVar5,lVar5);
                  if ((int)uVar4 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","KINSol",
                            (ulong)uVar4);
                    return 1;
                  }
                  puts("\nComputed solution:");
                  PrintOutput(y);
                  puts("\nFinal statsistics:");
                  KINPrintAllStats(local_48,_stdout,0);
                  __stream = fopen("kinRoboKin_dns_stats.csv","w");
                  local_38 = lVar7;
                  KINPrintAllStats(local_48,__stream,1);
                  fclose(__stream);
                  N_VDestroy(y);
                  N_VDestroy(lVar5);
                  N_VDestroy(plVar6);
                  KINFree(&local_48);
                  SUNLinSolFree(lVar8);
                  SUNMatDestroy(local_38);
                  SUNContext_Free(&local_40);
                  return 0;
                }
                pcVar10 = "KINSetMaxSetupCalls";
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,(ulong)uVar4);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, scsteptol;
  N_Vector y, scale, constraints;
  int mset, retval, i;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;
  FILE* FID;

  y = scale = constraints = NULL;
  kmem                    = NULL;
  J                       = NULL;
  LS                      = NULL;

  printf("\nRobot Kinematics Example\n");
  printf("8 variables; -1 <= x_i <= 1\n");
  printf("KINSOL problem size: 8 + 2*8 = 24 \n\n");

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Create vectors for solution, scales, and constraints */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize and allocate memory for KINSOL */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  retval = KINInit(kmem, func, y); /* y passed as a template */
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* Set optional inputs */

  N_VConst(ZERO, constraints);
  for (i = NVAR + 1; i <= NEQ; i++) { Ith(constraints, i) = ONE; }

  retval = KINSetConstraints(kmem, constraints);
  if (check_retval(&retval, "KINSetConstraints", 1)) { return (1); }

  fnormtol = FTOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  scsteptol = STOL;
  retval    = KINSetScaledStepTol(kmem, scsteptol);
  if (check_retval(&retval, "KINSetScaledStepTol", 1)) { return (1); }

  /* Create dense SUNMatrix */
  J = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)J, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to KINSOL */
  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* Set the Jacobian function */
  retval = KINSetJacFn(kmem, jac);
  if (check_retval(&retval, "KINSetJacFn", 1)) { return (1); }

  /* Indicate exact Newton */

  mset   = 1;
  retval = KINSetMaxSetupCalls(kmem, mset);
  if (check_retval(&retval, "KINSetMaxSetupCalls", 1)) { return (1); }

  /* Initial guess */

  N_VConst(ONE, y);
  for (i = 1; i <= NVAR; i++) { Ith(y, i) = SUNRsqrt(TWO) / TWO; }

  printf("Initial guess:\n");
  PrintOutput(y);

  /* Call KINSol to solve problem */

  N_VConst(ONE, scale);
  retval = KINSol(kmem,           /* KINSol memory block */
                  y,              /* initial guess on input; solution vector */
                  KIN_LINESEARCH, /* global strategy choice */
                  scale,          /* scaling vector, for the variable cc */
                  scale);         /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  printf("\nComputed solution:\n");
  PrintOutput(y);

  /* Print final statistics to screen and file */

  printf("\nFinal statsistics:\n");
  retval = KINPrintAllStats(kmem, stdout, SUN_OUTPUTFORMAT_TABLE);

  FID    = fopen("kinRoboKin_dns_stats.csv", "w");
  retval = KINPrintAllStats(kmem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* free memory */
  N_VDestroy(y);
  N_VDestroy(scale);
  N_VDestroy(constraints);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  SUNContext_Free(&sunctx);

  return (0);
}